

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

void signature_set(signature s,size_t index,char *name,type t)

{
  int iVar1;
  signature_node psVar2;
  size_t sVar3;
  char *pcVar4;
  type in_RCX;
  char *in_RDX;
  ulong in_RSI;
  long in_RDI;
  char *name_node;
  size_t name_size;
  signature_node node;
  size_t in_stack_ffffffffffffffd0;
  signature in_stack_ffffffffffffffd8;
  
  if (((in_RDI != 0) && (in_RSI < *(ulong *)(in_RDI + 0x10))) && (in_RDX != (char *)0x0)) {
    psVar2 = signature_at(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    sVar3 = strlen(in_RDX);
    sVar3 = sVar3 + 1;
    pcVar4 = (char *)malloc(sVar3);
    if (pcVar4 == (char *)0x0) {
      log_write_impl_va("metacall",0xe4,"signature_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_signature.c"
                        ,3,"Invalid signature name allocation");
    }
    else {
      if (psVar2->name != (char *)0x0) {
        free(psVar2->name);
      }
      psVar2->name = pcVar4;
      memcpy(psVar2->name,in_RDX,sVar3);
      psVar2->t = in_RCX;
      psVar2->index = in_RSI;
      iVar1 = set_insert(*(undefined8 *)(in_RDI + 8),psVar2->name,psVar2);
      if (iVar1 != 0) {
        free(psVar2->name);
        psVar2->index = 0xffffffffffffffff;
        psVar2->name = (char *)0x0;
        psVar2->t = (type)0x0;
        log_write_impl_va("metacall",0xfe,"signature_set",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_signature.c"
                          ,3,"Invalid signature set insertion");
      }
    }
  }
  return;
}

Assistant:

void signature_set(signature s, size_t index, const char *name, type t)
{
	if (s != NULL && index < s->count && name != NULL)
	{
		signature_node node = signature_at(s, index);

		size_t name_size = strlen(name) + 1;

		char *name_node = malloc(sizeof(char) * name_size);

		if (name_node == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid signature name allocation");

			return;
		}

		if (node->name != NULL)
		{
			free(node->name);
		}

		node->name = name_node;

		memcpy(node->name, name, name_size);

		node->t = t;

		node->index = index;

		if (set_insert(s->map, (set_key)node->name, (set_value)node) != 0)
		{
			free(node->name);

			node->index = REFLECT_SIGNATURE_INVALID_INDEX;
			node->name = NULL;
			node->t = NULL;

			log_write("metacall", LOG_LEVEL_ERROR, "Invalid signature set insertion");
		}
	}
}